

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::processCommunications
          (CommonCore *this,LocalFederateId federateID,milliseconds msToWait)

{
  bool bVar1;
  FederateStates FVar2;
  FederateState *this_00;
  char *__str;
  undefined8 uVar3;
  undefined4 in_ESI;
  FederateState *fed;
  FederateState *in_stack_00000128;
  milliseconds in_stack_00000130;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  this_00 = getFederateAt((CommonCore *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                          (LocalFederateId)(BaseType)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (this_00 == (FederateState *)0x0) {
    __str = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffb0,__str);
    InvalidIdentifier::InvalidIdentifier
              ((InvalidIdentifier *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
    __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  bVar1 = FederateState::isCallbackFederate(this_00);
  if (!bVar1) {
    FVar2 = FederateState::getState((FederateState *)0x525577);
    if ((FVar2 != TERMINATING) && (FVar2 != FINISHED)) {
      FederateState::processCommunications(in_stack_00000128,in_stack_00000130);
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  InvalidFunctionCall::InvalidFunctionCall
            ((InvalidFunctionCall *)in_stack_ffffffffffffffb0,(string_view)in_stack_ffffffffffffffb8
            );
  __cxa_throw(uVar3,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
}

Assistant:

void CommonCore::processCommunications(LocalFederateId federateID,
                                       std::chrono::milliseconds msToWait)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (processCommunications)"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "process Comms operation is not permitted for callback based federates"));
    }
    switch (fed->getState()) {
        case FederateStates::FINISHED:
        case FederateStates::TERMINATING:
            return;
        default:
            break;
    }
    fed->processCommunications(msToWait);
}